

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

void __thiscall just::test::assertion_failed::~assertion_failed(assertion_failed *this)

{
  assertion_failed *this_local;
  
  std::__cxx11::string::~string((string *)&this->_filename);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

assertion_failed(
        const std::string& msg_,
        const std::string& filename_,
        int line_
      ) :
        _msg(msg_),
        _filename(filename_),
        _line(line_)
      {}